

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long mkvparser::AudioTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               AudioTrack **pResult)

{
  IMkvReader *pReader;
  bool bVar1;
  int iVar2;
  AudioTrack *this;
  long stop;
  long lVar3;
  long lVar4;
  longlong pos;
  longlong size;
  double rate;
  longlong id;
  long local_88;
  longlong local_80;
  double local_78;
  Info *local_70;
  longlong local_68;
  longlong local_60;
  AudioTrack **local_58;
  Segment *local_50;
  longlong local_48;
  longlong local_40;
  long local_38;
  
  lVar3 = -1;
  if ((*pResult == (AudioTrack *)0x0) && (info->type == 2)) {
    pReader = pSegment->m_pReader;
    local_88 = (info->settings).start;
    stop = local_88 + (info->settings).size;
    local_78 = 8000.0;
    local_68 = 1;
    local_60 = 0;
    lVar4 = lVar3;
    local_70 = info;
    local_58 = pResult;
    local_50 = pSegment;
    local_48 = element_start;
    local_40 = element_size;
    do {
      if (stop <= local_88) {
        if (local_88 != stop) {
          return -2;
        }
        this = (AudioTrack *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
        if (this == (AudioTrack *)0x0) {
          this = (AudioTrack *)0x0;
        }
        else {
          AudioTrack(this,local_50,local_48,local_40);
        }
        if (this == (AudioTrack *)0x0) {
          return -1;
        }
        iVar2 = Track::Info::Copy(local_70,&(this->super_Track).m_info);
        if (iVar2 != 0) {
          (*(this->super_Track)._vptr_Track[1])(this);
          return -1;
        }
        this->m_rate = local_78;
        this->m_channels = local_68;
        this->m_bitDepth = local_60;
        *local_58 = this;
        return 0;
      }
      lVar3 = ParseElementHeader(pReader,&local_88,stop,&local_38,&local_80);
      if (lVar3 < 0) {
LAB_001625e8:
        bVar1 = false;
      }
      else {
        if (local_38 == 0x9f) {
          lVar3 = UnserializeUInt(pReader,local_88,local_80);
          local_68 = lVar3;
LAB_0016261d:
          if (0 < lVar3) {
LAB_00162622:
            local_88 = local_88 + local_80;
            bVar1 = local_88 <= stop;
            lVar3 = lVar4;
            if (stop < local_88) {
              lVar3 = -2;
            }
            goto LAB_00162640;
          }
        }
        else {
          if (local_38 == 0x6264) {
            lVar3 = UnserializeUInt(pReader,local_88,local_80);
            local_60 = lVar3;
            goto LAB_0016261d;
          }
          if (local_38 != 0xb5) goto LAB_00162622;
          lVar3 = UnserializeFloat(pReader,local_88,local_80,&local_78);
          if (lVar3 < 0) goto LAB_001625e8;
          if (0.0 < local_78) goto LAB_00162622;
        }
        bVar1 = false;
        lVar3 = -2;
      }
LAB_00162640:
      lVar4 = lVar3;
    } while (bVar1);
  }
  return lVar3;
}

Assistant:

long AudioTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       AudioTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kAudio)
    return -1;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  double rate = 8000.0;  // MKV default
  long long channels = 1;
  long long bit_depth = 0;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSamplingFrequency) {
      status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvChannels) {
      channels = UnserializeUInt(pReader, pos, size);

      if (channels <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvBitDepth) {
      bit_depth = UnserializeUInt(pReader, pos, size);

      if (bit_depth <= 0)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  AudioTrack* const pTrack =
      new (std::nothrow) AudioTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {
    delete pTrack;
    return status;
  }

  pTrack->m_rate = rate;
  pTrack->m_channels = channels;
  pTrack->m_bitDepth = bit_depth;

  pResult = pTrack;
  return 0;  // success
}